

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O2

bool __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::DoPrepareNextMultiobjSolve
          (MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,function<mp::sol::Status_()> *get_stt,function<mp::Solution_()> *get_sol)

{
  pointer *this_00;
  int iVar1;
  BasicSolver *pBVar2;
  bool bVar3;
  pair<bool,_mp::sol::Status> pVar4;
  pair<bool,_mp::sol::Status> pVar5;
  pair<bool,_mp::sol::Status> proc_sol;
  pair<bool,_mp::sol::Status> local_68;
  char *local_60;
  function<mp::Solution_()> local_58;
  function<mp::sol::Status_()> local_38;
  
  iVar1 = this->i_current_obj_;
  pVar5 = (pair<bool,_mp::sol::Status>)((long)iVar1 + 1);
  this->i_current_obj_ = pVar5._0_4_;
  pVar4 = (pair<bool,_mp::sol::Status>)
          (((long)(this->obj_new_).
                  super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->obj_new_).
                 super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x1e8);
  if ((ulong)pVar5 < (ulong)pVar4) {
    pBVar2 = (BasicSolver *)
             this[2].obj_new_.
             super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pBVar2->verbose_ == true) {
      local_60 = (char *)CONCAT44(local_60._4_4_,iVar1 + 2);
      local_68 = pVar4;
      BasicSolver::Print<int,unsigned_long>
                (pBVar2,(CStringRef)0x368b15,(int *)&local_60,(unsigned_long *)&local_68);
      pVar5.second = SOLVED;
      pVar5._0_4_ = this->i_current_obj_;
    }
    if (pVar5._0_4_ != 0) {
      std::function<mp::sol::Status_()>::function(&local_38,get_stt);
      std::function<mp::Solution_()>::function(&local_58,get_sol);
      pVar5 = ProcessMOIterationPostsolvedSolution(this,&local_38,&local_58);
      local_68 = pVar5;
      std::_Function_base::~_Function_base(&local_58.super__Function_base);
      std::_Function_base::~_Function_base(&local_38.super__Function_base);
      if (((ulong)pVar5 & 1) == 0) {
        pBVar2 = (BasicSolver *)
                 this[2].obj_new_.
                 super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pBVar2->verbose_ == true) {
          local_60 = sol::GetStatusName(pVar5.second);
          BasicSolver::Print<char_const*,mp::sol::Status>
                    (pBVar2,(CStringRef)0x368b9b,&local_60,&local_68.second);
        }
        goto LAB_0030df00;
      }
      RestrictLastObjVal(this);
    }
    this_00 = &this[-5].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
    ConstraintManager::FillConstraintCounters
              ((ConstraintManager *)this_00,(BasicFlatModelAPI *)&this[7].obj_new_tolr_,
               (FlatModelInfo *)this[-1].objval_last_);
    ReplaceCurrentObj(this);
    ConstraintManager::AddUnbridgedConstraintsToBackend
              ((ConstraintManager *)this_00,(BasicFlatModelAPI *)&this[7].obj_new_tolr_,
               (ItemNamer *)&this[-2].i_current_obj_);
    bVar3 = true;
  }
  else {
    this->status_ = FINISHED;
    pBVar2 = (BasicSolver *)
             this[2].obj_new_.
             super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pBVar2->verbose_ == true) {
      BasicSolver::Print<>(pBVar2,(CStringRef)0x368aa6);
    }
LAB_0030df00:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool DoPrepareNextMultiobjSolve(
      std::function<sol::Status(void)> get_stt, std::function<Solution(void)> get_sol) {
    if (++i_current_obj_ >= obj_new_.size()) {
      status_ = MOManagerStatus::FINISHED;
			if (MPD( GetEnv() ).verbose_mode())
				MPD( GetEnv() ).Print(
							"\n\n"
							"==============================================================================\n"
							"MULTI-OBJECTIVE MODE: done.\n\n");
			return false;                              // all done
    }
    if (MPD( GetEnv() ).verbose_mode())
      MPD( GetEnv() ).Print(
          "\n\n"
          "MULTI-OBJECTIVE MODE: objective {} (out of {}) ...\n"
          "==============================================================================\n\n"
          , i_current_obj_+1, obj_new_.size());
    if (i_current_obj_) {
      auto proc_sol = ProcessMOIterationPostsolvedSolution(get_stt, get_sol);
      if (!proc_sol.first) {
        if (MPD( GetEnv() ).verbose_mode())
          MPD( GetEnv() ).Print(
              "   ... ABORTING: previous iteration's solve result: {} (code {}.)\n"
              "==============================================================================\n\n"
              , sol::GetStatusName(proc_sol.second), proc_sol.second);
        return false;
      }
      RestrictLastObjVal();
    }
    MPD( FillConstraintCounters( MPD( GetModelAPI() ), *MPD( GetModelInfoWrt() ) ) );   // @todo a hack.
    MPD( GetModelAPI() ).InitProblemModificationPhase(   // For adding the new constraint. @todo a hack.
        MPD( GetModelInfo() ));                          // Ideally Model would notice changes and notify
    ReplaceCurrentObj();                  // After allowing model modification (needed by SCIP.)
    MPD( AddUnbridgedConstraintsToBackend(
        MPD( GetModelAPI() ), MPD( GetVarNamer() )) );
    MPD( GetModelAPI() ).FinishProblemModificationPhase();            // ModelAPI automatically.
    return true;
  }